

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O1

void mkcavepos(xchar x,xchar y,int dist,boolean waslit,boolean rockit)

{
  char cVar1;
  uint uVar2;
  monst *pmVar3;
  int x_00;
  level *plVar4;
  trap *ptVar5;
  uint uVar6;
  int y_00;
  undefined7 in_register_00000031;
  monst *mtmp;
  undefined7 in_register_00000039;
  uint uVar7;
  schar local_40;
  char local_3c;
  
  plVar4 = level;
  x_00 = (int)CONCAT71(in_register_00000039,x);
  if ((byte)y < 0x15 && (byte)(x - 1U) < 0x4f) {
    cVar1 = level->locations[(byte)x][(byte)y].typ;
    y_00 = (int)CONCAT71(in_register_00000031,y);
    if (waslit == '\0') {
      if (cVar1 != '\x19') {
        uVar7 = 0x400;
        uVar6 = 0x800;
        local_40 = '\x19';
        goto LAB_00167d86;
      }
    }
    else if (('\x10' < cVar1) && (ptVar5 = t_at(level,x_00,y_00), ptVar5 == (trap *)0x0)) {
      pmVar3 = level->monsters[(byte)x][(byte)y];
      mtmp = (monst *)0x0;
      if ((pmVar3 != (monst *)0x0) && ((pmVar3->field_0x61 & 2) == 0)) {
        mtmp = pmVar3;
      }
      if (mtmp != (monst *)0x0) {
        local_40 = '\0';
        uVar6 = 0;
        uVar7 = 0;
        if ((mtmp->data->mflags1 & 8) != 0) goto LAB_00167d86;
        rloc(level,mtmp,'\0');
      }
      local_40 = '\0';
      uVar6 = 0;
      uVar7 = 0;
LAB_00167d86:
      unblock_point(x_00,y_00);
      plVar4->locations[(byte)x][(byte)y].seenv = '\0';
      uVar2 = *(uint *)&plVar4->locations[(byte)x][(byte)y].field_0x6;
      local_3c = (char)dist;
      uVar6 = uVar2 & 0xfffff00f | uVar7 | uVar6;
      if (local_3c == '\0') {
        uVar6 = uVar2 & 0xfffffa0f | uVar7;
      }
      *(uint *)&plVar4->locations[(byte)x][(byte)y].field_0x6 = uVar6 & 0xfffffc0f;
      viz_array[(byte)y][(byte)x] = '\x03';
      plVar4->locations[(byte)x][(byte)y].typ = local_40;
      if (((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
        feel_location(x,y);
        return;
      }
      newsym(x_00,y_00);
      return;
    }
  }
  return;
}

Assistant:

static void mkcavepos(xchar x, xchar y, int dist, boolean waslit, boolean rockit)
{
    struct rm *loc;

    if (!isok(x,y)) return;
    loc = &level->locations[x][y];

    if (rockit) {
	struct monst *mtmp;

	if (IS_ROCK(loc->typ)) return;
	if (t_at(level, x, y)) return; /* don't cover the portal */
	if ((mtmp = m_at(level, x, y)) != 0)	/* make sure crucial monsters survive */
	    if (!passes_walls(mtmp->data)) rloc(level, mtmp, FALSE);
    } else if (loc->typ == ROOM) return;

    unblock_point(x,y);	/* make sure vision knows this location is open */

    /* fake out saved state */
    loc->seenv = 0;
    loc->doormask = 0;
    if (dist < 3) loc->lit = (rockit ? FALSE : TRUE);
    if (waslit) loc->waslit = (rockit ? FALSE : TRUE);
    loc->horizontal = FALSE;
    viz_array[y][x] = (dist < 3 ) ?
	(IN_SIGHT|COULD_SEE) : /* short-circuit vision recalc */
	COULD_SEE;
    loc->typ = (rockit ? STONE : ROOM);
    if (dist >= 3)
	impossible("mkcavepos called with dist %d", dist);
    if (Blind)
	feel_location(x, y);
    else newsym(x,y);
}